

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

void lex_whitespace(Lexer *lxr)

{
  char cVar1;
  int iVar2;
  char ch;
  Lexer *lxr_local;
  
  while( true ) {
    iVar2 = is_whitespace(lxr->code[lxr->cursor]);
    if (iVar2 == 0) break;
    cVar1 = lxr->code[lxr->cursor];
    if ((cVar1 == '\n') || (cVar1 == '\r')) {
      if ((cVar1 == '\r') && (lxr->code[lxr->cursor + 1] == '\n')) {
        lxr->cursor = lxr->cursor + 1;
      }
      lxr->line = lxr->line + 1;
    }
    lxr->cursor = lxr->cursor + 1;
  }
  return;
}

Assistant:

static void lex_whitespace(Lexer *lxr) {
	while (is_whitespace(lxr->code[lxr->cursor])) {
		char ch = lxr->code[lxr->cursor];
		if (ch == '\n' || ch == '\r') {
			// Treat `\r\n` as a single newline
			if (ch == '\r' && lxr->code[lxr->cursor + 1] == '\n') {
				lxr->cursor++;
			}
			lxr->line++;
		}
		lxr->cursor++;
	}
}